

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O1

int ptls_hpke_setup_base_r
              (ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,
              ptls_key_exchange_context_t *keyex,ptls_aead_context_t **ctx,ptls_iovec_t pk_s,
              ptls_iovec_t info)

{
  ptls_iovec_t pk_r;
  ptls_iovec_t dh;
  int iVar1;
  uint8_t secret [64];
  ptls_iovec_t local_a8;
  ptls_hpke_cipher_suite_t *local_90;
  ptls_aead_context_t **local_88;
  ptls_key_exchange_context_t *local_80;
  undefined1 local_78 [72];
  
  pk_r = keyex->pubkey;
  local_a8.base = (uint8_t *)0x0;
  local_a8.len = 0;
  local_90 = cipher;
  local_88 = ctx;
  local_80 = keyex;
  iVar1 = (*keyex->on_exchange)(&local_80,0,&local_a8,pk_s);
  if (iVar1 == 0) {
    dh.len = local_a8.len;
    dh.base = local_a8.base;
    iVar1 = dh_derive(kem,local_78,pk_s,pk_r,dh);
  }
  else if (local_a8.base != (uint8_t *)0x0) {
    __assert_fail("dh.base == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/hpke.c",
                  0x9f,
                  "int dh_decap(ptls_hpke_kem_t *, void *, ptls_key_exchange_context_t *, ptls_iovec_t, ptls_iovec_t)"
                 );
  }
  if (local_a8.base != (uint8_t *)0x0) {
    (*ptls_clear_memory)(local_a8.base,local_a8.len);
    free(local_a8.base);
  }
  if (iVar1 == 0) {
    iVar1 = key_schedule(kem,local_90,local_88,0,local_78,info);
  }
  (*ptls_clear_memory)(local_78,0x40);
  return iVar1;
}

Assistant:

int ptls_hpke_setup_base_r(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, ptls_key_exchange_context_t *keyex,
                           ptls_aead_context_t **ctx, ptls_iovec_t pk_s, ptls_iovec_t info)
{
    uint8_t secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = dh_decap(kem, secret, keyex, pk_s, keyex->pubkey)) != 0)
        goto Exit;

    if ((ret = key_schedule(kem, cipher, ctx, 0, secret, info)) != 0)
        goto Exit;

Exit:
    ptls_clear_memory(secret, sizeof(secret));
    return ret;
}